

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::
CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test::TestBody
          (CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test *this)

{
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = 0xd0;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = 'A';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = 0x80;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = 0xe0;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0xf0;
  CpuAbsoluteIndexedTest::run_read_instruction_with_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,0xf9,Y);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest,
        sbc_absy_no_carry_or_overflow_with_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG | C_FLAG;
    expected.p = N_FLAG;
    expected.a = 0xE0;
    memory_content = 0xF0;

    run_read_instruction_with_pagecrossing(SBC_ABSY, IndexReg::Y);
}